

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void address_space_update_topology_pass
               (AddressSpace *as,FlatView *old_view,FlatView *new_view,_Bool adding)

{
  FlatRange *pFVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  MemoryListener *pMVar7;
  ulong uVar8;
  _Bool _Var9;
  FlatRange *a;
  uint uVar10;
  FlatRange *b;
  uint uVar11;
  MemoryRegionSection mrs;
  MemoryRegionSection local_78;
  long local_38;
  
  uVar10 = 0;
  uVar11 = 0;
  do {
    local_38 = (ulong)uVar10 << 6;
    for (; uVar11 < old_view->nr; uVar11 = uVar11 + 1) {
      pFVar1 = old_view->ranges;
      a = pFVar1 + uVar11;
      if (uVar10 < new_view->nr) {
        b = (FlatRange *)((long)&new_view->ranges->mr + local_38);
        if (pFVar1 == (FlatRange *)0x0) goto LAB_00cee0df;
        if (new_view->ranges == (FlatRange *)0x0) goto LAB_00cedf76;
        uVar2 = (ulong)(a->addr).start;
        lVar3 = *(long *)((long)&(a->addr).start + 8);
        uVar4 = (ulong)(b->addr).start;
        lVar5 = *(long *)((long)&(b->addr).start + 8);
        uVar8 = (ulong)(uVar2 < uVar4);
        if (((SBORROW8(lVar3,lVar5) != SBORROW8(lVar3 - lVar5,uVar8)) !=
             (long)((lVar3 - lVar5) - uVar8) < 0) ||
           ((lVar3 == lVar5 && uVar2 == uVar4 && (_Var9 = flatrange_equal(a,b), !_Var9))))
        goto LAB_00cedf76;
        _Var9 = flatrange_equal(a,b);
        if (!_Var9) goto LAB_00cee0df;
        if (!adding) goto LAB_00cee0c3;
        local_78.fv = as->current_map;
        local_78.size._0_8_ = (undefined8)(b->addr).size;
        local_78.size._8_8_ = *(undefined8 *)((long)&(b->addr).size + 8);
        local_78.mr = b->mr;
        local_78.offset_within_region = b->offset_in_region;
        if (lVar5 == 0) {
          local_78.readonly = b->readonly;
          local_78.offset_within_address_space = uVar4;
          for (pMVar7 = (as->listeners).tqh_first; pMVar7 != (MemoryListener *)0x0;
              pMVar7 = (pMVar7->link_as).tqe_next) {
            if (pMVar7->region_nop != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0)
            {
              (*pMVar7->region_nop)(pMVar7,&local_78);
            }
          }
LAB_00cee0c3:
          uVar11 = uVar11 + 1;
          goto LAB_00cee15c;
        }
        goto LAB_00cee172;
      }
      if (pFVar1 == (FlatRange *)0x0) {
        b = (FlatRange *)0x0;
        goto LAB_00cee0df;
      }
LAB_00cedf76:
      if (adding) goto LAB_00cee00b;
      local_78.fv = as->current_map;
      local_78.size._0_8_ = (undefined8)(a->addr).size;
      local_78.size._8_8_ = *(undefined8 *)((long)&(a->addr).size + 8);
      local_78.mr = a->mr;
      local_78.offset_within_region = a->offset_in_region;
      if (*(long *)((long)&(a->addr).start + 8) != 0) goto LAB_00cee172;
      local_78.offset_within_address_space = (hwaddr)(a->addr).start;
      local_78.readonly = a->readonly;
      for (pvVar6 = ((as->listeners).tqh_circ.tql_prev)->tql_prev->tql_next; pvVar6 != (void *)0x0;
          pvVar6 = (void *)**(long **)(*(long *)((long)pvVar6 + 0x48) + 8)) {
        if (*(code **)((long)pvVar6 + 0x18) != (code *)0x0) {
          (**(code **)((long)pvVar6 + 0x18))(pvVar6,&local_78);
        }
      }
LAB_00cee00b:
    }
    if (new_view->nr <= uVar10) {
      return;
    }
    b = (FlatRange *)((long)&new_view->ranges->mr + local_38);
LAB_00cee0df:
    if (adding) {
      local_78.fv = as->current_map;
      local_78.size._0_8_ = (undefined8)(b->addr).size;
      local_78.size._8_8_ = *(undefined8 *)((long)&(b->addr).size + 8);
      local_78.mr = b->mr;
      local_78.offset_within_region = b->offset_in_region;
      if (*(long *)((long)&(b->addr).start + 8) != 0) {
LAB_00cee172:
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      local_78.offset_within_address_space = (hwaddr)(b->addr).start;
      local_78.readonly = b->readonly;
      for (pMVar7 = (as->listeners).tqh_first; pMVar7 != (MemoryListener *)0x0;
          pMVar7 = (pMVar7->link_as).tqe_next) {
        if (pMVar7->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
          (*pMVar7->region_add)(pMVar7,&local_78);
        }
      }
    }
LAB_00cee15c:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static void address_space_update_topology_pass(AddressSpace *as,
                                               const FlatView *old_view,
                                               const FlatView *new_view,
                                               bool adding)
{
    unsigned iold, inew;
    FlatRange *frold, *frnew;

    /* Generate a symmetric difference of the old and new memory maps.
     * Kill ranges in the old map, and instantiate ranges in the new map.
     */
    iold = inew = 0;
    while (iold < old_view->nr || inew < new_view->nr) {
        if (iold < old_view->nr) {
            frold = &old_view->ranges[iold];
        } else {
            frold = NULL;
        }
        if (inew < new_view->nr) {
            frnew = &new_view->ranges[inew];
        } else {
            frnew = NULL;
        }

        if (frold
            && (!frnew
                || int128_lt(frold->addr.start, frnew->addr.start)
                || (int128_eq(frold->addr.start, frnew->addr.start)
                    && !flatrange_equal(frold, frnew)))) {
            /* In old but not in new, or in both but attributes changed. */

            if (!adding) {
                MEMORY_LISTENER_UPDATE_REGION(frold, as, Reverse, region_del);
            }

            ++iold;
        } else if (frold && frnew && flatrange_equal(frold, frnew)) {
            /* In both and unchanged (except logging may have changed) */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_nop);
            }

            ++iold;
            ++inew;
        } else {
            /* In new */

            if (adding) {
                MEMORY_LISTENER_UPDATE_REGION(frnew, as, Forward, region_add);
            }

            ++inew;
        }
    }
}